

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-init.c
# Opt level: O1

void cleanup_lore(void)

{
  monster_drop *pmVar1;
  monster_friends *pmVar2;
  monster_friends_base *pmVar3;
  monster_mimic *pmVar4;
  monster_drop *p;
  monster_friends *p_00;
  monster_friends_base *p_01;
  monster_mimic *p_02;
  monster_lore *pmVar5;
  ulong uVar6;
  
  if (z_info->r_max != 0) {
    uVar6 = 0;
    do {
      pmVar5 = l_list;
      p = l_list[uVar6].drops;
      while (p != (monster_drop *)0x0) {
        pmVar1 = p->next;
        mem_free(p);
        p = pmVar1;
      }
      p_00 = pmVar5[uVar6].friends;
      while (p_00 != (monster_friends *)0x0) {
        pmVar2 = p_00->next;
        mem_free(p_00);
        p_00 = pmVar2;
      }
      p_01 = pmVar5[uVar6].friends_base;
      while (p_01 != (monster_friends_base *)0x0) {
        pmVar3 = p_01->next;
        mem_free(p_01);
        p_01 = pmVar3;
      }
      p_02 = pmVar5[uVar6].mimic_kinds;
      while (p_02 != (monster_mimic *)0x0) {
        pmVar4 = p_02->next;
        mem_free(p_02);
        p_02 = pmVar4;
      }
      mem_free(pmVar5[uVar6].blows);
      mem_free(pmVar5[uVar6].blow_known);
      uVar6 = uVar6 + 1;
    } while (uVar6 < z_info->r_max);
  }
  mem_free(l_list);
  return;
}

Assistant:

static void cleanup_lore(void)
{
	int ridx;

	for (ridx = 0; ridx < z_info->r_max; ridx++) {
		struct monster_lore *l = &l_list[ridx];
		struct monster_drop *d;
		struct monster_friends *f;
		struct monster_friends_base *fb;
		struct monster_mimic *m;

		d = l->drops;
		while (d) {
			struct monster_drop *dn = d->next;
			mem_free(d);
			d = dn;
		}
		f = l->friends;
		while (f) {
			struct monster_friends *fn = f->next;
			mem_free(f);
			f = fn;
		}
		fb = l->friends_base;
		while (fb) {
			struct monster_friends_base *fbn = fb->next;
			mem_free(fb);
			fb = fbn;
		}
		m = l->mimic_kinds;
		while (m) {
			struct monster_mimic *mn = m->next;
			mem_free(m);
			m = mn;
		}
		mem_free(l->blows);
		mem_free(l->blow_known);
	}

	mem_free(l_list);
}